

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

void Diligent::LoadShaderCodeVariableDesc
               (Compiler *Compiler,TypeID *TypeID,Bitset *Decoration,bool IsHLSLSource,
               ShaderCodeVariableDescX *TypeDesc)

{
  Uint8 UVar1;
  BaseType BVar2;
  char *pcVar3;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar4;
  SHADER_CODE_BASIC_TYPE SVar5;
  uchar uVar6;
  uint32_t uVar7;
  uint index;
  SPIRType *type;
  string *psVar8;
  size_t sVar9;
  Bitset *Decoration_00;
  char (*Args_1) [9];
  ulong uVar10;
  ShaderCodeVariableDesc VarDesc;
  string msg;
  string local_70;
  string local_50;
  
  type = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)TypeID->id);
  BVar2 = type->basetype;
  if ((ulong)BVar2 == 0xf) {
    (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_STRUCT;
  }
  else {
    if ((type->vecsize < 2) || (type->columns < 2)) {
      if (type->vecsize < 2) {
        (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
      }
      else {
        (TypeDesc->super_ShaderCodeVariableDesc).Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
      }
    }
    else if ((Decoration->lower & 0x10) == 0) {
      (TypeDesc->super_ShaderCodeVariableDesc).Class =
           SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS - IsHLSLSource;
    }
    else {
      (TypeDesc->super_ShaderCodeVariableDesc).Class =
           IsHLSLSource + SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS;
    }
    if ((BVar2 < ControlPointArray) && ((0x1f7fffU >> (BVar2 & (MeshGridProperties|Int)) & 1) != 0))
    {
      SVar5 = (&DAT_0070e6e8)[BVar2];
    }
    else {
      FormatString<char[24]>((string *)&VarDesc,(char (*) [24])"Unknown SPIRV base type");
      DebugAssertionFailed
                (VarDesc.Name,"SpirvBaseTypeToShaderCodeBasicType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x124);
      std::__cxx11::string::~string((string *)&VarDesc);
      SVar5 = SHADER_CODE_BASIC_TYPE_UNKNOWN;
    }
    (TypeDesc->super_ShaderCodeVariableDesc).BasicType = SVar5;
    uVar6 = StaticCast<unsigned_char,unsigned_int>(&type->vecsize);
    (TypeDesc->super_ShaderCodeVariableDesc).NumRows = uVar6;
    uVar6 = StaticCast<unsigned_char,unsigned_int>(&type->columns);
    (TypeDesc->super_ShaderCodeVariableDesc).NumColumns = uVar6;
    if (IsHLSLSource) {
      UVar1 = (TypeDesc->super_ShaderCodeVariableDesc).NumRows;
      (TypeDesc->super_ShaderCodeVariableDesc).NumRows = uVar6;
      (TypeDesc->super_ShaderCodeVariableDesc).NumColumns = UVar1;
    }
  }
  psVar8 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_(Compiler,(ID)TypeID->id);
  std::__cxx11::string::string((string *)&local_50,(string *)psVar8);
  ShaderCodeVariableDescX::SetTypeName(TypeDesc,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar3 = (TypeDesc->super_ShaderCodeVariableDesc).TypeName;
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    psVar8 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_
                       (Compiler,(ID)(type->parent_type).id);
    std::__cxx11::string::string((string *)&local_70,(string *)psVar8);
    ShaderCodeVariableDescX::SetTypeName(TypeDesc,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar3 = (TypeDesc->super_ShaderCodeVariableDesc).TypeName;
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      ShaderCodeVariableDescX::SetDefaultTypeName
                (TypeDesc,SHADER_SOURCE_LANGUAGE_GLSL - IsHLSLSource);
    }
  }
  index = 0;
  Args_1 = (char (*) [9])0x0;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    Args_1 = (char (*) [9])(ulong)*(type->array).super_VectorView<unsigned_int>.ptr;
  }
  (TypeDesc->super_ShaderCodeVariableDesc).ArraySize = (Uint32)Args_1;
  for (; uVar10 = (ulong)index,
      uVar10 < (type->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
               buffer_size; index = index + 1) {
    VarDesc.Class = SHADER_CODE_VARIABLE_CLASS_UNKNOWN;
    VarDesc.BasicType = SHADER_CODE_BASIC_TYPE_UNKNOWN;
    VarDesc.NumRows = '\0';
    VarDesc.NumColumns = '\0';
    VarDesc.Offset = 0;
    VarDesc.ArraySize = 0;
    VarDesc.NumMembers = 0;
    VarDesc.Name = (char *)0x0;
    VarDesc.TypeName = (char *)0x0;
    VarDesc.pMembers = (ShaderCodeVariableDesc *)0x0;
    psVar8 = diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
                       (Compiler,(TypeID)TypeID->id,index);
    VarDesc.Name = (psVar8->_M_dataplus)._M_p;
    if (*VarDesc.Name == '\0') {
      psVar8 = diligent_spirv_cross::Compiler::get_member_name_abi_cxx11_
                         (Compiler,(TypeID)(type->parent_type).id,index);
      VarDesc.Name = (psVar8->_M_dataplus)._M_p;
    }
    uVar7 = diligent_spirv_cross::Compiler::type_struct_member_offset(Compiler,type,index);
    VarDesc.Offset = uVar7;
    sVar9 = ShaderCodeVariableDescX::AddMember(TypeDesc,&VarDesc);
    if (sVar9 != uVar10) {
      FormatString<char[26],char[9]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"idx == i",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadShaderCodeVariableDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x15f);
      std::__cxx11::string::~string((string *)&msg);
    }
    pTVar4 = (type->member_types).
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
    Decoration_00 =
         diligent_spirv_cross::Compiler::get_member_decoration_bitset
                   (Compiler,(TypeID)TypeID->id,index);
    Args_1 = (char (*) [9])(ulong)(uint)IsHLSLSource;
    LoadShaderCodeVariableDesc
              (Compiler,pTVar4 + uVar10,Decoration_00,IsHLSLSource,
               (TypeDesc->Members).
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10);
  }
  return;
}

Assistant:

void LoadShaderCodeVariableDesc(const diligent_spirv_cross::Compiler& Compiler,
                                const diligent_spirv_cross::TypeID&   TypeID,
                                const diligent_spirv_cross::Bitset&   Decoration,
                                bool                                  IsHLSLSource,
                                ShaderCodeVariableDescX&              TypeDesc)
{
    const auto& SpvType = Compiler.get_type(TypeID);
    if (SpvType.basetype == diligent_spirv_cross::SPIRType::Struct)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_STRUCT;
    }
    else if (SpvType.vecsize > 1 && SpvType.columns > 1)
    {
        if (Decoration.get(spv::Decoration::DecorationRowMajor))
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS : SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS;
        else
            TypeDesc.Class = IsHLSLSource ? SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS : SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    }
    else if (SpvType.vecsize > 1)
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    }
    else
    {
        TypeDesc.Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    }

    if (TypeDesc.Class != SHADER_CODE_VARIABLE_CLASS_STRUCT)
    {
        TypeDesc.BasicType  = SpirvBaseTypeToShaderCodeBasicType(SpvType.basetype);
        TypeDesc.NumRows    = StaticCast<decltype(TypeDesc.NumRows)>(SpvType.vecsize);
        TypeDesc.NumColumns = StaticCast<decltype(TypeDesc.NumColumns)>(SpvType.columns);
        if (IsHLSLSource)
            std::swap(TypeDesc.NumRows, TypeDesc.NumColumns);
    }

    TypeDesc.SetTypeName(Compiler.get_name(TypeID));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetTypeName(Compiler.get_name(SpvType.parent_type));
    if (TypeDesc.TypeName == nullptr || TypeDesc.TypeName[0] == '\0')
        TypeDesc.SetDefaultTypeName(IsHLSLSource ? SHADER_SOURCE_LANGUAGE_HLSL : SHADER_SOURCE_LANGUAGE_GLSL);

    TypeDesc.ArraySize = !SpvType.array.empty() ? SpvType.array[0] : 0;

    for (uint32_t i = 0; i < SpvType.member_types.size(); ++i)
    {
        ShaderCodeVariableDesc VarDesc;
        VarDesc.Name = Compiler.get_member_name(TypeID, i).c_str();
        if (VarDesc.Name[0] == '\0')
            VarDesc.Name = Compiler.get_member_name(SpvType.parent_type, i).c_str();

        VarDesc.Offset = Compiler.type_struct_member_offset(SpvType, i);

        auto idx = TypeDesc.AddMember(VarDesc);
        VERIFY_EXPR(idx == i);
        LoadShaderCodeVariableDesc(Compiler, SpvType.member_types[i], Compiler.get_member_decoration_bitset(TypeID, i), IsHLSLSource, TypeDesc.GetMember(i));
    }
}